

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DataDeclarationSyntax::setChild
          (DataDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar7;
  DataTypeSyntax *pDVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar10;
  TokenList *pTVar11;
  logic_error *this_00;
  long *plVar12;
  size_type *psVar13;
  long *plVar14;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar12;
    psVar13 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar13) {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0.field_2._8_8_ = plVar12[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar13;
    }
    local_b0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::to_string(&local_70,0xe35);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_90 == plVar14) {
      local_80 = *plVar14;
      lStack_78 = plVar12[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar14;
    }
    local_88 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_f0 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar12[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
    }
    local_e8 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar9);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pTVar11 = SyntaxNode::as<slang::syntax::TokenList>(*ppSVar9);
    (this->modifiers).super_SyntaxListBase.super_SyntaxNode.parent =
         (pTVar11->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->modifiers).super_SyntaxListBase.super_SyntaxNode.kind =
         (pTVar11->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->modifiers).super_SyntaxListBase.childCount = (pTVar11->super_SyntaxListBase).childCount;
    sVar1 = (pTVar11->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
    (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
         (pTVar11->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
    (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 2:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::DataTypeSyntax *>::not_null(U &&) [T = slang::syntax::DataTypeSyntax *, U = slang::syntax::DataTypeSyntax *]"
                );
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pDVar8 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(*ppSVar9);
    (this->type).ptr = pDVar8;
    break;
  case 3:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar10 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>>
                        (*ppSVar9);
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar10->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar10->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->declarators).super_SyntaxListBase.childCount = (pSVar10->super_SyntaxListBase).childCount
    ;
    sVar1 = (pSVar10->elements).size_;
    (this->declarators).elements.data_ = (pSVar10->elements).data_;
    (this->declarators).elements.size_ = sVar1;
    break;
  case 4:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar7->field_0x2;
    NVar4.raw = (pvVar7->numFlags).raw;
    uVar5 = pvVar7->rawLen;
    pIVar2 = pvVar7->info;
    (this->semi).kind = pvVar7->kind;
    (this->semi).field_0x2 = uVar3;
    (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi).rawLen = uVar5;
    (this->semi).info = pIVar2;
  }
  return;
}

Assistant:

void DataDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: modifiers = child.node()->as<TokenList>(); return;
        case 2: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}